

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_switch_Dyy(response_layer *layer,integral_image *iimage)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int _a_1;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  int width;
  uint uVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int _a;
  float *data_7;
  int iVar41;
  float *data;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  float local_158 [2];
  undefined1 *local_150;
  ulong local_148;
  float *local_140;
  bool *local_138;
  integral_image *local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  int height;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  bool *local_e0;
  float *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  int local_b8;
  undefined4 uStack_b4;
  long local_b0;
  int local_a4;
  long local_a0;
  ulong local_98;
  int local_8c;
  ulong uStack_88;
  int data_width;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  int local_48;
  undefined4 uStack_44;
  ulong local_40;
  ulong local_38;
  
  uVar1 = iimage->height;
  iVar20 = layer->filter_size;
  if (iVar20 <= (int)uVar1) {
    compute_response_layer_Dyy_laplacian_locality_inlined(layer,iimage);
    return;
  }
  uVar7 = iimage->width;
  uVar19 = (iVar20 + -1) - (iVar20 + -1 >> 0x1f) >> 1;
  local_c8 = (ulong)uVar19;
  uVar3 = iVar20 / 3;
  uVar18 = (ulong)uVar3;
  if ((int)uVar1 <= (int)uVar19) {
    local_a4 = layer->height;
    iVar35 = iimage->data_width;
    local_130 = iimage;
    pfVar2 = iimage->data;
    iVar24 = layer->step;
    lVar40 = (long)iVar24;
    fVar49 = 1.0 / (float)(iVar20 * iVar20);
    local_140 = layer->response;
    local_138 = layer->laplacian;
    local_f8 = uVar18;
    local_128 = lVar40;
    if ((int)uVar3 < (int)uVar7) {
      local_150 = (undefined1 *)local_158;
      lVar38 = (long)local_158 - ((ulong)uVar7 * 4 + 0xf & 0xfffffffffffffff0);
      iVar41 = layer->width * iVar24;
      if (iVar41 - uVar3 == 0 || iVar41 < (int)uVar3) {
        lVar15 = 0;
      }
      else {
        lVar15 = 0;
        do {
          *(float *)(lVar38 + lVar15 * 4) =
               pfVar2[(int)((uVar3 - 1) + (uVar1 - 1) * iVar35 + (int)lVar15)];
          lVar15 = lVar15 + lVar40;
        } while (lVar15 < (long)(ulong)(iVar41 - uVar3));
      }
      iVar35 = (uVar1 - 1) * iVar35;
      fVar53 = pfVar2[(int)((uVar7 - 1) + iVar35)];
      if ((int)lVar15 < (int)uVar3) {
        lVar15 = (long)(int)lVar15;
        do {
          *(float *)(lVar38 + lVar15 * 4) = fVar53;
          lVar15 = lVar15 + lVar40;
        } while (lVar15 < (int)uVar3);
      }
      lVar34 = (long)iVar41;
      iVar9 = (int)lVar15;
      if (iVar9 < iVar41) {
        lVar15 = (long)iVar9;
        iVar35 = (iVar35 + iVar9) - uVar3;
        do {
          *(float *)(lVar38 + lVar15 * 4) = fVar53 - pfVar2[iVar35];
          lVar15 = lVar15 + lVar40;
          iVar35 = iVar35 + iVar24;
        } while (lVar15 < lVar34);
      }
      local_a4 = local_a4 * iVar24;
      if (0 < local_a4) {
        uVar1 = iVar20 / 6;
        local_108 = (ulong)(uVar3 * 2);
        local_120 = (ulong)(uVar3 - uVar1);
        _height = (ulong)uVar1;
        local_148 = (ulong)-uVar1;
        uVar29 = iVar20 - (int)local_c8;
        uVar7 = -(int)local_c8;
        local_c8 = (ulong)uVar7;
        uVar19 = -uVar3;
        local_d0 = (ulong)uVar19;
        local_118 = 0;
        local_8c = 0;
        local_a0 = lVar38;
        local_100 = (ulong)uVar29;
        local_7c = iVar41;
        local_b0 = lVar34;
        auVar44 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        do {
          iVar20 = (int)local_118;
          if (0 < iVar41) {
            uVar8 = iVar20 - uVar1;
            iVar35 = local_130->data_width;
            uVar23 = local_130->height;
            uVar26 = uVar8;
            if ((int)uVar23 < (int)uVar8) {
              uVar26 = uVar23;
            }
            local_70 = (ulong)uVar26;
            iVar24 = (int)uVar18;
            uVar14 = uVar8 + iVar24;
            if ((int)uVar23 <= (int)(uVar8 + iVar24)) {
              uVar14 = uVar23;
            }
            local_78 = (ulong)uVar14;
            uVar30 = (uVar26 - 1) * iVar35;
            local_c0 = (ulong)uVar30;
            iVar9 = (uVar14 - 1) * iVar35;
            _local_b8 = CONCAT44(uStack_b4,iVar9);
            uVar8 = iVar20 - iVar24;
            uVar6 = uVar8 + 1;
            if ((int)uVar23 < (int)(uVar8 + 1)) {
              uVar6 = uVar23;
            }
            local_f0 = (ulong)uVar6;
            uVar10 = uVar3 * 2 + uVar8;
            if ((int)uVar23 <= (int)uVar10) {
              uVar10 = uVar23;
            }
            local_e8 = (ulong)uVar10;
            uVar36 = (uVar6 - 1) * iVar35;
            local_50 = (ulong)uVar36;
            iVar11 = (uVar10 - 1) * iVar35;
            _local_48 = CONCAT44(uStack_44,iVar11);
            if ((int)uVar23 < (int)uVar8) {
              uVar8 = uVar23;
            }
            local_68 = (ulong)uVar8;
            local_60 = (ulong)uVar23;
            if (iVar20 < (int)uVar23) {
              local_60 = local_118;
            }
            uVar12 = (uVar8 - 1) * iVar35;
            local_40 = (ulong)uVar12;
            iVar5 = (int)local_60;
            uVar13 = (iVar5 + -1) * iVar35;
            local_38 = (ulong)uVar13;
            uVar27 = iVar20 + 1U;
            if ((int)uVar23 < (int)(iVar20 + 1U)) {
              uVar27 = uVar23;
            }
            uVar21 = iVar20 + 1 + iVar24;
            if ((int)uVar21 < (int)uVar23) {
              uVar23 = uVar21;
            }
            local_58 = (ulong)uVar27;
            uVar21 = (uVar27 - 1) * iVar35;
            local_98 = (ulong)uVar21;
            local_d8 = local_140 + local_8c;
            uVar22 = (uVar23 - 1) * iVar35;
            uStack_88 = (ulong)uVar22;
            local_e0 = local_138 + local_8c;
            pfVar2 = local_130->data;
            iVar35 = local_130->width;
            lVar40 = 0;
            lVar15 = 0;
            do {
              iVar24 = (int)lVar15;
              iVar31 = uVar19 + 1 + iVar24;
              if (iVar35 < iVar31) {
                iVar31 = iVar35;
              }
              iVar17 = (int)uVar18 + iVar24;
              if (iVar35 <= iVar17) {
                iVar17 = iVar35;
              }
              fVar50 = 0.0;
              fVar53 = 0.0;
              if ((0 < (int)uVar26) && (0 < iVar31)) {
                fVar53 = pfVar2[(int)(uVar30 + iVar31 + -1)];
              }
              if ((0 < (int)uVar26) && (0 < iVar17)) {
                fVar50 = pfVar2[(int)(uVar30 + iVar17 + -1)];
              }
              fVar51 = 0.0;
              fVar52 = 0.0;
              if ((0 < (int)uVar14) && (0 < iVar31)) {
                fVar52 = pfVar2[iVar31 + -1 + iVar9];
              }
              if ((0 < (int)uVar14) && (0 < iVar17)) {
                fVar51 = pfVar2[iVar17 + -1 + iVar9];
              }
              iVar31 = uVar7 + iVar24;
              if (iVar35 < iVar31) {
                iVar31 = iVar35;
              }
              iVar17 = uVar29 + iVar24;
              if (iVar35 <= iVar17) {
                iVar17 = iVar35;
              }
              fVar55 = 0.0;
              auVar42 = vmaxss_avx(ZEXT416((uint)(((fVar53 - fVar50) - fVar52) + fVar51)),
                                   ZEXT816(0) << 0x40);
              auVar42 = vfmadd213ss_fma(auVar42,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(*(uint *)(lVar38 + lVar15 * 4)));
              fVar53 = 0.0;
              if ((0 < (int)uVar6) && (0 < iVar31)) {
                fVar53 = pfVar2[(int)(uVar36 + iVar31 + -1)];
              }
              if ((0 < (int)uVar6) && (0 < iVar17)) {
                fVar55 = pfVar2[(int)(uVar36 + iVar17 + -1)];
              }
              fVar52 = 0.0;
              fVar50 = 0.0;
              if ((0 < (int)uVar10) && (0 < iVar31)) {
                fVar50 = pfVar2[iVar31 + -1 + iVar11];
              }
              if ((0 < (int)uVar10) && (0 < iVar17)) {
                fVar52 = pfVar2[iVar17 + -1 + iVar11];
              }
              iVar31 = -uVar1 + iVar24;
              if (iVar35 < iVar31) {
                iVar31 = iVar35;
              }
              iVar17 = (uVar3 - uVar1) + iVar24;
              if (iVar35 <= iVar17) {
                iVar17 = iVar35;
              }
              fVar51 = 0.0;
              if ((0 < (int)uVar6) && (0 < iVar31)) {
                fVar51 = pfVar2[(int)(uVar36 + iVar31 + -1)];
              }
              fVar54 = 0.0;
              if ((0 < (int)uVar6) && (0 < iVar17)) {
                fVar54 = pfVar2[(int)(uVar36 + iVar17 + -1)];
              }
              fVar56 = 0.0;
              fVar57 = 0.0;
              if ((0 < (int)uVar10) && (0 < iVar31)) {
                fVar57 = pfVar2[iVar31 + -1 + iVar11];
              }
              if ((0 < (int)uVar10) && (0 < iVar17)) {
                fVar56 = pfVar2[iVar17 + -1 + iVar11];
              }
              auVar48 = vmaxss_avx(ZEXT416((uint)(((fVar53 - fVar55) - fVar50) + fVar52)),
                                   ZEXT816(0) << 0x40);
              iVar31 = iVar24 + 1;
              if (iVar35 < iVar24 + 1) {
                iVar31 = iVar35;
              }
              iVar39 = iVar31 + -1;
              iVar17 = iVar24 + 1 + (int)uVar18;
              if (iVar35 <= iVar17) {
                iVar17 = iVar35;
              }
              fVar50 = 0.0;
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar56 + ((fVar51 - fVar54) - fVar57))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar45,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar53 = 0.0;
              if ((0 < (int)uVar8) && (0 < iVar31)) {
                fVar53 = pfVar2[(int)(uVar12 + iVar39)];
              }
              iVar32 = iVar17 + -1;
              if ((0 < (int)uVar8) && (0 < iVar17)) {
                fVar50 = pfVar2[(int)(uVar12 + iVar32)];
              }
              fVar51 = 0.0;
              fVar52 = 0.0;
              if ((0 < iVar5) && (0 < iVar31)) {
                fVar52 = pfVar2[(int)(uVar13 + iVar39)];
              }
              if ((0 < iVar5) && (0 < iVar17)) {
                fVar51 = pfVar2[(int)(uVar13 + iVar32)];
              }
              iVar25 = uVar19 + iVar24;
              if (iVar35 < (int)(uVar19 + iVar24)) {
                iVar25 = iVar35;
              }
              iVar37 = iVar25 + -1;
              iVar33 = iVar35;
              if (iVar24 < iVar35) {
                iVar33 = iVar24;
              }
              fVar55 = 0.0;
              if ((0 < (int)uVar27) && (0 < iVar25)) {
                fVar55 = pfVar2[(int)(uVar21 + iVar37)];
              }
              iVar24 = iVar33 + -1;
              fVar54 = 0.0;
              if ((0 < (int)uVar27) && (0 < iVar33)) {
                fVar54 = pfVar2[(int)(uVar21 + iVar24)];
              }
              fVar56 = 0.0;
              fVar57 = 0.0;
              if ((0 < (int)uVar23) && (0 < iVar25)) {
                fVar57 = pfVar2[(int)(uVar22 + iVar37)];
              }
              if ((0 < (int)uVar23) && (0 < iVar33)) {
                fVar56 = pfVar2[(int)(uVar22 + iVar24)];
              }
              auVar45 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar45);
              if ((0 < (int)uVar8) && (0 < iVar25)) {
                in_ZMM16 = ZEXT464((uint)pfVar2[(int)(uVar12 + iVar37)]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar45);
              if ((0 < (int)uVar8) && (0 < iVar33)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[(int)(uVar12 + iVar24)]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar45);
              if ((0 < iVar5) && (0 < iVar25)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[(int)(iVar37 + uVar13)]);
              }
              if ((0 < iVar5) && (0 < iVar33)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[(int)(iVar24 + uVar13)]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar45);
              if ((0 < (int)uVar27) && (0 < iVar31)) {
                in_ZMM21 = ZEXT464((uint)pfVar2[(int)(uVar21 + iVar39)]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar45);
              if ((0 < (int)uVar27) && (0 < iVar17)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[(int)(uVar21 + iVar32)]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar45);
              if ((0 < (int)uVar23) && (0 < iVar31)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[(int)(iVar39 + uVar22)]);
              }
              if ((0 < (int)uVar23) && (0 < iVar17)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[(int)(iVar32 + uVar22)]);
              }
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar51 + ((fVar53 - fVar50) - fVar52))),
                                   ZEXT816(0) << 0x40);
              auVar43 = vmaxss_avx(ZEXT416((uint)(fVar56 + ((fVar55 - fVar54) - fVar57))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM19._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM18._0_16_);
              auVar47 = vmaxss_avx512f(auVar46,auVar44);
              auVar46 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
              auVar46 = vsubss_avx512f(auVar46,in_ZMM24._0_16_);
              auVar46 = vaddss_avx512f(auVar46,in_ZMM23._0_16_);
              auVar46 = vmaxss_avx(auVar46,ZEXT816(0) << 0x40);
              fVar53 = fVar49 * auVar42._0_4_;
              fVar50 = fVar49 * auVar48._0_4_;
              fVar52 = fVar49 * (((auVar45._0_4_ + auVar43._0_4_) - auVar47._0_4_) - auVar46._0_4_);
              auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * fVar52 * -0.81)),
                                        ZEXT416((uint)fVar50),ZEXT416((uint)fVar53));
              (local_140 + local_8c)[lVar40] = auVar42._0_4_;
              (local_138 + local_8c)[lVar40] = 0.0 <= fVar53 + fVar50;
              lVar15 = lVar15 + local_128;
              lVar40 = lVar40 + 1;
              uVar18 = local_f8;
            } while (lVar15 < lVar34);
            local_8c = local_8c + (int)lVar40;
            lVar40 = local_128;
          }
          uVar23 = iVar20 + (int)lVar40;
          local_118 = (ulong)uVar23;
        } while ((int)uVar23 < local_a4);
      }
    }
    else {
      fVar53 = pfVar2[(int)((uVar1 - 1) * iVar35 + -1 + uVar7)];
      iVar41 = layer->width * iVar24;
      uVar29 = iVar20 / 6;
      if (iVar41 - uVar29 == 0 || iVar41 < (int)uVar29) {
        iVar9 = 0;
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        iVar9 = 0;
        auVar44 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar44);
        auVar42 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar42);
        do {
          iVar11 = (int)uVar18;
          auVar48 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[(int)((~uVar29 + uVar3 + iVar11) * iVar35 +
                                                              (uVar7 - 1))]),
                                    SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar53));
          if (0 < iVar41) {
            fVar50 = fVar49 * auVar48._0_4_;
            uVar23 = iVar11 - uVar3;
            uVar26 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar26 = uVar1;
            }
            uVar8 = uVar3 * 2 + uVar23;
            if ((int)uVar1 <= (int)uVar8) {
              uVar8 = uVar1;
            }
            iVar31 = (uVar26 - 1) * iVar35;
            iVar5 = (uVar8 - 1) * iVar35;
            if ((int)uVar1 < (int)uVar23) {
              uVar23 = uVar1;
            }
            uVar4 = (ulong)uVar1;
            if (iVar11 < (int)uVar1) {
              uVar4 = uVar18;
            }
            iVar39 = (int)uVar4;
            iVar17 = (uVar23 - 1) * iVar35;
            iVar32 = (iVar39 + -1) * iVar35;
            uVar14 = iVar11 + 1U;
            if ((int)uVar1 < (int)(iVar11 + 1U)) {
              uVar14 = uVar1;
            }
            uVar6 = uVar3 + 1 + iVar11;
            if ((int)uVar1 <= (int)uVar6) {
              uVar6 = uVar1;
            }
            iVar11 = (uVar14 - 1) * iVar35;
            iVar25 = (uVar6 - 1) * iVar35;
            lVar38 = 0;
            uVar30 = 0;
            do {
              uVar10 = uVar30 - uVar19;
              if ((int)uVar7 < (int)(uVar30 - uVar19)) {
                uVar10 = uVar7;
              }
              uVar36 = (iVar20 - uVar19) + uVar30;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar51 = 0.0;
              fVar52 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar10)) {
                fVar52 = pfVar2[(int)(iVar31 + (uVar10 - 1))];
              }
              if ((0 < (int)uVar26) && (0 < (int)uVar36)) {
                fVar51 = pfVar2[(int)(iVar31 + (uVar36 - 1))];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar36)) {
                fVar54 = pfVar2[(int)((uVar36 - 1) + iVar5)];
              }
              uVar10 = uVar30 - uVar29;
              if ((int)uVar7 < (int)(uVar30 - uVar29)) {
                uVar10 = uVar7;
              }
              uVar36 = (uVar3 - uVar29) + uVar30;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar10)) {
                fVar57 = pfVar2[(int)(iVar31 + (uVar10 - 1))];
              }
              fVar56 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar36)) {
                fVar56 = pfVar2[(int)((uVar36 - 1) + iVar31)];
              }
              fVar58 = 0.0;
              fVar59 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar59 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar36)) {
                fVar58 = pfVar2[(int)((uVar36 - 1) + iVar5)];
              }
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar52 - fVar51) - fVar55))),
                                   ZEXT816(0) << 0x40);
              uVar10 = uVar30 + 1;
              if ((int)uVar7 < (int)(uVar30 + 1)) {
                uVar10 = uVar7;
              }
              iVar33 = uVar10 - 1;
              uVar36 = uVar30 + 1 + uVar3;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar51 = 0.0;
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar57 - fVar56) - fVar59))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar45,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar52 = 0.0;
              if ((0 < (int)uVar23) && (0 < (int)uVar10)) {
                fVar52 = pfVar2[iVar17 + iVar33];
              }
              iVar37 = uVar36 - 1;
              if ((0 < (int)uVar23) && (0 < (int)uVar36)) {
                fVar51 = pfVar2[iVar17 + iVar37];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < iVar39) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[iVar32 + iVar33];
              }
              if ((0 < iVar39) && (0 < (int)uVar36)) {
                fVar54 = pfVar2[iVar32 + iVar37];
              }
              uVar27 = uVar30 - uVar3;
              if ((int)uVar7 < (int)(uVar30 - uVar3)) {
                uVar27 = uVar7;
              }
              iVar28 = uVar27 - 1;
              uVar12 = uVar7;
              if ((int)uVar30 < (int)uVar7) {
                uVar12 = uVar30;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar27)) {
                fVar57 = pfVar2[iVar11 + iVar28];
              }
              iVar16 = uVar12 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar56 = pfVar2[iVar11 + iVar16];
              }
              fVar58 = 0.0;
              fVar59 = 0.0;
              if ((0 < (int)uVar6) && (0 < (int)uVar27)) {
                fVar59 = pfVar2[iVar25 + iVar28];
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar58 = pfVar2[iVar25 + iVar16];
              }
              auVar45 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar45);
              if ((0 < (int)uVar23) && (0 < (int)uVar27)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[iVar17 + iVar28]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar45);
              if ((0 < (int)uVar23) && (0 < (int)uVar12)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar17 + iVar16]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar45);
              if ((0 < iVar39) && (0 < (int)uVar27)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar28 + iVar32]);
              }
              if ((0 < iVar39) && (0 < (int)uVar12)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar16 + iVar32]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar45);
              if ((0 < (int)uVar14) && (0 < (int)uVar10)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[iVar11 + iVar33]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar45);
              if ((0 < (int)uVar14) && (0 < (int)uVar36)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar11 + iVar37]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar45);
              if ((0 < (int)uVar6) && (0 < (int)uVar10)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar33 + iVar25]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar36)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar37 + iVar25]);
              }
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar52 - fVar51) - fVar55))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vmaxss_avx512f(ZEXT416((uint)(((fVar57 - fVar56) - fVar59) + fVar58)),
                                       auVar44);
              auVar43 = vsubss_avx512f(in_ZMM17._0_16_,in_ZMM18._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM20._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM19._0_16_);
              auVar47 = vmaxss_avx512f(auVar43,auVar42);
              auVar43 = vsubss_avx512f(in_ZMM22._0_16_,in_ZMM23._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM25._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM24._0_16_);
              auVar43 = vmaxss_avx(auVar43,ZEXT816(0) << 0x40);
              fVar52 = fVar49 * auVar48._0_4_;
              fVar51 = fVar49 * (((auVar46._0_4_ + auVar45._0_4_) - auVar47._0_4_) - auVar43._0_4_);
              auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * -0.81 * fVar51)),
                                        ZEXT416((uint)fVar52),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar38] = auVar48._0_4_;
              local_138[lVar38 + iVar9] = 0.0 <= fVar50 + fVar52;
              uVar30 = uVar30 + iVar24;
              lVar38 = lVar38 + 1;
            } while ((int)uVar30 < iVar41);
            iVar9 = iVar9 + (int)lVar38;
          }
          uVar18 = uVar18 + lVar40;
        } while ((long)uVar18 < (long)(ulong)(iVar41 - uVar29));
      }
      auVar42 = in_ZMM22._0_16_;
      auVar44 = in_ZMM17._0_16_;
      fVar53 = fVar53 * -2.0;
      uVar23 = (uint)uVar18;
      if ((int)uVar23 <= (int)uVar29) {
        fVar50 = fVar49 * fVar53;
        auVar48 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar48);
        auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar45);
        do {
          uVar23 = (uint)uVar18;
          if (0 < iVar41) {
            uVar26 = uVar23 - uVar3;
            uVar8 = uVar26 + 1;
            if ((int)uVar1 < (int)(uVar26 + 1)) {
              uVar8 = uVar1;
            }
            uVar14 = uVar3 * 2 + uVar26;
            if ((int)uVar1 <= (int)uVar14) {
              uVar14 = uVar1;
            }
            iVar5 = (uVar8 - 1) * iVar35;
            iVar11 = (uVar14 - 1) * iVar35;
            if ((int)uVar1 < (int)uVar26) {
              uVar26 = uVar1;
            }
            uVar6 = uVar1;
            if ((int)uVar23 < (int)uVar1) {
              uVar6 = uVar23;
            }
            iVar31 = (uVar26 - 1) * iVar35;
            iVar17 = (uVar6 - 1) * iVar35;
            uVar30 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar30 = uVar1;
            }
            uVar10 = uVar23 + 1 + uVar3;
            if ((int)uVar1 <= (int)uVar10) {
              uVar10 = uVar1;
            }
            iVar39 = (uVar30 - 1) * iVar35;
            iVar32 = (uVar10 - 1) * iVar35;
            lVar38 = 0;
            uVar36 = 0;
            do {
              uVar27 = uVar36 - uVar19;
              if ((int)uVar7 < (int)(uVar36 - uVar19)) {
                uVar27 = uVar7;
              }
              uVar12 = (iVar20 - uVar19) + uVar36;
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              fVar51 = 0.0;
              fVar52 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar27)) {
                fVar52 = pfVar2[(int)(iVar5 + (uVar27 - 1))];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar12)) {
                fVar51 = pfVar2[(int)(iVar5 + (uVar12 - 1))];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar27)) {
                fVar55 = pfVar2[(int)((uVar27 - 1) + iVar11)];
              }
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar54 = pfVar2[(int)((uVar12 - 1) + iVar11)];
              }
              uVar27 = uVar36 - uVar29;
              if ((int)uVar7 < (int)(uVar36 - uVar29)) {
                uVar27 = uVar7;
              }
              uVar12 = (uVar3 - uVar29) + uVar36;
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar27)) {
                fVar57 = pfVar2[(int)(iVar5 + (uVar27 - 1))];
              }
              fVar56 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar12)) {
                fVar56 = pfVar2[(int)((uVar12 - 1) + iVar5)];
              }
              fVar58 = 0.0;
              fVar59 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar27)) {
                fVar59 = pfVar2[(int)((uVar27 - 1) + iVar11)];
              }
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar58 = pfVar2[(int)((uVar12 - 1) + iVar11)];
              }
              auVar44 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar52 - fVar51) - fVar55))),
                                   ZEXT816(0) << 0x40);
              uVar27 = uVar36 + 1;
              if ((int)uVar7 < (int)(uVar36 + 1)) {
                uVar27 = uVar7;
              }
              iVar25 = uVar27 - 1;
              uVar12 = uVar36 + 1 + uVar3;
              if ((int)uVar7 <= (int)uVar12) {
                uVar12 = uVar7;
              }
              fVar51 = 0.0;
              auVar42 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar57 - fVar56) - fVar59))),
                                   ZEXT816(0) << 0x40);
              auVar44 = vfmadd132ss_fma(auVar42,auVar44,SUB6416(ZEXT464(0xc0400000),0));
              fVar52 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar27)) {
                fVar52 = pfVar2[iVar31 + iVar25];
              }
              iVar33 = uVar12 - 1;
              if ((0 < (int)uVar26) && (0 < (int)uVar12)) {
                fVar51 = pfVar2[iVar31 + iVar33];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < (int)uVar6) && (0 < (int)uVar27)) {
                fVar55 = pfVar2[iVar17 + iVar25];
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar54 = pfVar2[iVar17 + iVar33];
              }
              uVar13 = uVar36 - uVar3;
              if ((int)uVar7 < (int)(uVar36 - uVar3)) {
                uVar13 = uVar7;
              }
              iVar37 = uVar13 - 1;
              uVar21 = uVar7;
              if ((int)uVar36 < (int)uVar7) {
                uVar21 = uVar36;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar30) && (0 < (int)uVar13)) {
                fVar57 = pfVar2[iVar37 + iVar39];
              }
              iVar28 = uVar21 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar30) && (0 < (int)uVar21)) {
                fVar56 = pfVar2[iVar39 + iVar28];
              }
              fVar58 = 0.0;
              fVar59 = 0.0;
              if ((0 < (int)uVar10) && (0 < (int)uVar13)) {
                fVar59 = pfVar2[iVar32 + iVar37];
              }
              if ((0 < (int)uVar10) && (0 < (int)uVar21)) {
                fVar58 = pfVar2[iVar32 + iVar28];
              }
              auVar42 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar42);
              if ((0 < (int)uVar26) && (0 < (int)uVar13)) {
                in_ZMM17 = ZEXT464((uint)pfVar2[iVar31 + iVar37]);
              }
              auVar42 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar42);
              if ((0 < (int)uVar26) && (0 < (int)uVar21)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar31 + iVar28]);
              }
              auVar42 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar42);
              auVar42 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar42);
              if ((0 < (int)uVar6) && (0 < (int)uVar13)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar37 + iVar17]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar21)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar28 + iVar17]);
              }
              auVar42 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar42);
              if ((0 < (int)uVar30) && (0 < (int)uVar27)) {
                in_ZMM22 = ZEXT464((uint)pfVar2[iVar39 + iVar25]);
              }
              auVar42 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar42);
              if ((0 < (int)uVar30) && (0 < (int)uVar12)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar39 + iVar33]);
              }
              auVar42 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar42);
              auVar42 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar42);
              if ((0 < (int)uVar10) && (0 < (int)uVar27)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar25 + iVar32]);
              }
              if ((0 < (int)uVar10) && (0 < (int)uVar12)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar33 + iVar32]);
              }
              auVar42 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar52 - fVar51) - fVar55))),
                                   ZEXT816(0) << 0x40);
              auVar46 = vmaxss_avx512f(ZEXT416((uint)(((fVar57 - fVar56) - fVar59) + fVar58)),
                                       auVar48);
              auVar43 = vsubss_avx512f(in_ZMM17._0_16_,in_ZMM18._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM20._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM19._0_16_);
              auVar47 = vmaxss_avx512f(auVar43,auVar45);
              auVar43 = vsubss_avx512f(in_ZMM22._0_16_,in_ZMM23._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM25._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM24._0_16_);
              auVar43 = vmaxss_avx(auVar43,ZEXT816(0) << 0x40);
              fVar52 = fVar49 * auVar44._0_4_;
              fVar51 = fVar49 * (((auVar46._0_4_ + auVar42._0_4_) - auVar47._0_4_) - auVar43._0_4_);
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * -0.81 * fVar51)),
                                        ZEXT416((uint)fVar52),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar38] = auVar44._0_4_;
              local_138[lVar38 + iVar9] = 0.0 <= fVar50 + fVar52;
              uVar36 = uVar36 + iVar24;
              lVar38 = lVar38 + 1;
            } while ((int)uVar36 < iVar41);
            iVar9 = iVar9 + (int)lVar38;
          }
          auVar42 = in_ZMM22._0_16_;
          auVar44 = in_ZMM17._0_16_;
          uVar23 = uVar23 + iVar24;
          uVar18 = (ulong)uVar23;
        } while ((int)uVar23 <= (int)uVar29);
      }
      if ((int)uVar23 < local_a4 * iVar24) {
        uVar18 = (ulong)(int)uVar23;
        auVar44 = vxorps_avx512vl(auVar44,auVar44);
        auVar42 = vxorps_avx512vl(auVar42,auVar42);
        do {
          iVar11 = (int)uVar18;
          auVar48 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[(int)((iVar11 + ~uVar29) * iVar35 +
                                                              (uVar7 - 1))]),
                                    SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar53));
          if (0 < iVar41) {
            fVar50 = fVar49 * auVar48._0_4_;
            uVar23 = iVar11 - uVar3;
            uVar26 = uVar23 + 1;
            if ((int)uVar1 < (int)(uVar23 + 1)) {
              uVar26 = uVar1;
            }
            uVar8 = uVar3 * 2 + uVar23;
            if ((int)uVar1 <= (int)uVar8) {
              uVar8 = uVar1;
            }
            iVar31 = (uVar26 - 1) * iVar35;
            iVar5 = (uVar8 - 1) * iVar35;
            if ((int)uVar1 < (int)uVar23) {
              uVar23 = uVar1;
            }
            uVar4 = (ulong)uVar1;
            if (iVar11 < (int)uVar1) {
              uVar4 = uVar18;
            }
            iVar39 = (int)uVar4;
            iVar17 = (uVar23 - 1) * iVar35;
            iVar32 = (iVar39 + -1) * iVar35;
            uVar14 = iVar11 + 1U;
            if ((int)uVar1 < (int)(iVar11 + 1U)) {
              uVar14 = uVar1;
            }
            uVar6 = uVar3 + 1 + iVar11;
            if ((int)uVar1 <= (int)uVar6) {
              uVar6 = uVar1;
            }
            iVar11 = (uVar14 - 1) * iVar35;
            iVar25 = (uVar6 - 1) * iVar35;
            lVar38 = 0;
            uVar30 = 0;
            do {
              uVar10 = uVar30 - uVar19;
              if ((int)uVar7 < (int)(uVar30 - uVar19)) {
                uVar10 = uVar7;
              }
              uVar36 = (iVar20 - uVar19) + uVar30;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar51 = 0.0;
              fVar52 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar10)) {
                fVar52 = pfVar2[(int)(iVar31 + (uVar10 - 1))];
              }
              if ((0 < (int)uVar26) && (0 < (int)uVar36)) {
                fVar51 = pfVar2[(int)(iVar31 + (uVar36 - 1))];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar36)) {
                fVar54 = pfVar2[(int)((uVar36 - 1) + iVar5)];
              }
              uVar10 = uVar30 - uVar29;
              if ((int)uVar7 < (int)(uVar30 - uVar29)) {
                uVar10 = uVar7;
              }
              uVar36 = (uVar3 - uVar29) + uVar30;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar10)) {
                fVar57 = pfVar2[(int)(iVar31 + (uVar10 - 1))];
              }
              fVar56 = 0.0;
              if ((0 < (int)uVar26) && (0 < (int)uVar36)) {
                fVar56 = pfVar2[(int)((uVar36 - 1) + iVar31)];
              }
              fVar58 = 0.0;
              fVar59 = 0.0;
              if ((0 < (int)uVar8) && (0 < (int)uVar10)) {
                fVar59 = pfVar2[(int)((uVar10 - 1) + iVar5)];
              }
              if ((0 < (int)uVar8) && (0 < (int)uVar36)) {
                fVar58 = pfVar2[(int)((uVar36 - 1) + iVar5)];
              }
              auVar48 = vmaxss_avx(ZEXT416((uint)(fVar54 + ((fVar52 - fVar51) - fVar55))),
                                   ZEXT816(0) << 0x40);
              uVar10 = uVar30 + 1;
              if ((int)uVar7 < (int)(uVar30 + 1)) {
                uVar10 = uVar7;
              }
              iVar33 = uVar10 - 1;
              uVar36 = uVar30 + 1 + uVar3;
              if ((int)uVar7 <= (int)uVar36) {
                uVar36 = uVar7;
              }
              fVar51 = 0.0;
              auVar45 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar57 - fVar56) - fVar59))),
                                   ZEXT816(0) << 0x40);
              auVar48 = vfmadd132ss_fma(auVar45,auVar48,SUB6416(ZEXT464(0xc0400000),0));
              fVar52 = 0.0;
              if ((0 < (int)uVar23) && (0 < (int)uVar10)) {
                fVar52 = pfVar2[iVar17 + iVar33];
              }
              iVar37 = uVar36 - 1;
              if ((0 < (int)uVar23) && (0 < (int)uVar36)) {
                fVar51 = pfVar2[iVar17 + iVar37];
              }
              fVar54 = 0.0;
              fVar55 = 0.0;
              if ((0 < iVar39) && (0 < (int)uVar10)) {
                fVar55 = pfVar2[iVar32 + iVar33];
              }
              if ((0 < iVar39) && (0 < (int)uVar36)) {
                fVar54 = pfVar2[iVar32 + iVar37];
              }
              uVar27 = uVar30 - uVar3;
              if ((int)uVar7 < (int)(uVar30 - uVar3)) {
                uVar27 = uVar7;
              }
              iVar28 = uVar27 - 1;
              uVar12 = uVar7;
              if ((int)uVar30 < (int)uVar7) {
                uVar12 = uVar30;
              }
              fVar57 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar27)) {
                fVar57 = pfVar2[iVar28 + iVar11];
              }
              iVar16 = uVar12 - 1;
              fVar56 = 0.0;
              if ((0 < (int)uVar14) && (0 < (int)uVar12)) {
                fVar56 = pfVar2[iVar11 + iVar16];
              }
              fVar59 = 0.0;
              auVar45 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar45);
              if ((0 < (int)uVar6) && (0 < (int)uVar27)) {
                in_ZMM16 = ZEXT464((uint)pfVar2[iVar25 + iVar28]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar12)) {
                fVar59 = pfVar2[iVar25 + iVar16];
              }
              auVar45 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar45);
              if ((0 < (int)uVar23) && (0 < (int)uVar27)) {
                in_ZMM18 = ZEXT464((uint)pfVar2[iVar17 + iVar28]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar45);
              if ((0 < (int)uVar23) && (0 < (int)uVar12)) {
                in_ZMM19 = ZEXT464((uint)pfVar2[iVar17 + iVar16]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar45);
              if ((0 < iVar39) && (0 < (int)uVar27)) {
                in_ZMM21 = ZEXT464((uint)pfVar2[iVar28 + iVar32]);
              }
              if ((0 < iVar39) && (0 < (int)uVar12)) {
                in_ZMM20 = ZEXT464((uint)pfVar2[iVar16 + iVar32]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar45);
              if ((0 < (int)uVar14) && (0 < (int)uVar10)) {
                in_ZMM23 = ZEXT464((uint)pfVar2[iVar11 + iVar33]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar45);
              if ((0 < (int)uVar14) && (0 < (int)uVar36)) {
                in_ZMM24 = ZEXT464((uint)pfVar2[iVar11 + iVar37]);
              }
              auVar45 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
              in_ZMM25 = ZEXT1664(auVar45);
              auVar45 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
              in_ZMM26 = ZEXT1664(auVar45);
              if ((0 < (int)uVar6) && (0 < (int)uVar10)) {
                in_ZMM26 = ZEXT464((uint)pfVar2[iVar33 + iVar25]);
              }
              if ((0 < (int)uVar6) && (0 < (int)uVar36)) {
                in_ZMM25 = ZEXT464((uint)pfVar2[iVar37 + iVar25]);
              }
              auVar45 = vmaxss_avx(ZEXT416((uint)(((fVar52 - fVar51) - fVar55) + fVar54)),
                                   ZEXT816(0) << 0x40);
              auVar43 = vsubss_avx512f(ZEXT416((uint)(fVar57 - fVar56)),in_ZMM16._0_16_);
              auVar46 = vmaxss_avx512f(ZEXT416((uint)(auVar43._0_4_ + fVar59)),auVar44);
              auVar43 = vsubss_avx512f(in_ZMM18._0_16_,in_ZMM19._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM21._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM20._0_16_);
              auVar47 = vmaxss_avx512f(auVar43,auVar42);
              auVar43 = vsubss_avx512f(in_ZMM23._0_16_,in_ZMM24._0_16_);
              auVar43 = vsubss_avx512f(auVar43,in_ZMM26._0_16_);
              auVar43 = vaddss_avx512f(auVar43,in_ZMM25._0_16_);
              auVar43 = vmaxss_avx(auVar43,ZEXT816(0) << 0x40);
              fVar52 = fVar49 * auVar48._0_4_;
              fVar51 = (((auVar45._0_4_ + auVar46._0_4_) - auVar47._0_4_) - auVar43._0_4_) * fVar49;
              auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar51 * -0.81)),
                                        ZEXT416((uint)fVar52),ZEXT416((uint)fVar50));
              local_140[iVar9 + lVar38] = auVar48._0_4_;
              local_138[lVar38 + iVar9] = 0.0 <= fVar50 + fVar52;
              uVar30 = uVar30 + iVar24;
              lVar38 = lVar38 + 1;
            } while ((int)uVar30 < iVar41);
            iVar9 = iVar9 + (int)lVar38;
          }
          uVar18 = uVar18 + lVar40;
        } while ((long)uVar18 < (long)(local_a4 * iVar24));
      }
    }
    return;
  }
  if (SBORROW4(uVar7,uVar3 * 2) == (int)(uVar7 + uVar3 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy(struct response_layer *layer, struct integral_image *iimage) {
    /*
        optimizations:
            - Case distinction to calculate Dyy filter more optimaly
            - Combination of different functions and uses them depending on case
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int i, j, k, k0;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_inlined(layer, iimage);

    } else {
        // 2. Case The filter is taller than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image.
            // everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.  // TODO this makes no sense
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO fixer

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {

                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height*step; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}